

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

uint128_wrapper *
fmt::v7::detail::dragonbox::cache_accessor<double>::get_cached_power
          (uint128_wrapper *__return_storage_ptr__,int k)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint128_wrapper *puVar12;
  
  iVar6 = (int)__return_storage_ptr__;
  uVar8 = iVar6 + 0x124;
  if (0x26a < uVar8) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x75e,"k is out of range");
  }
  uVar2 = (uVar8 & 0xffff) / 0x1b;
  uVar7 = (ulong)(uVar2 << 4);
  puVar12 = *(uint128_wrapper **)(basic_data<void>::dragonbox_pow10_significands_128 + uVar7);
  lVar1 = *(long *)(basic_data<void>::dragonbox_pow10_significands_128 + uVar7 + 8);
  iVar9 = (ushort)((short)uVar2 * 0x1b) - 0x124;
  iVar11 = iVar6 - iVar9;
  if (iVar11 != 0) {
    iVar6 = floor_log2_pow10(iVar6);
    iVar9 = floor_log2_pow10(iVar9);
    if (0x3e < (uint)((iVar6 + -1) - (iVar9 + iVar11))) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                  ,0x772,"shifting error detected");
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar11 * 8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)puVar12 - (ulong)(uVar8 < 0x129);
    bVar3 = (char)iVar6 - (char)(iVar9 + iVar11) & 0x3f;
    uVar10 = SUB168(auVar4 * auVar5,0) >> bVar3 |
             SUB168(auVar4 * auVar5,8) +
             lVar1 * *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar11 * 8) << 0x40 - bVar3
    ;
    uVar7 = uVar10 + 1;
    if (0x128 < uVar8) {
      uVar7 = uVar10;
    }
    uVar10 = (ulong)(*(uint *)(basic_data<void>::dragonbox_pow10_recovery_errors +
                              (ulong)(uVar8 >> 4) * 4) >> (uVar8 * 2 & 0x1f) & 3);
    puVar12 = (uint128_wrapper *)(uVar10 + uVar7);
    if (CARRY8(uVar10,uVar7)) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                  ,0x78c,"");
    }
  }
  return puVar12;
}

Assistant:

static uint128_wrapper get_cached_power(int k) FMT_NOEXCEPT {
    FMT_ASSERT(k >= float_info<double>::min_k && k <= float_info<double>::max_k,
               "k is out of range");

#if FMT_USE_FULL_CACHE_DRAGONBOX
    return data::dragonbox_pow10_significands_128[k -
                                                  float_info<double>::min_k];
#else
    static const int compression_ratio = 27;

    // Compute base index.
    int cache_index = (k - float_info<double>::min_k) / compression_ratio;
    int kb = cache_index * compression_ratio + float_info<double>::min_k;
    int offset = k - kb;

    // Get base cache.
    uint128_wrapper base_cache =
        data::dragonbox_pow10_significands_128[cache_index];
    if (offset == 0) return base_cache;

    // Compute the required amount of bit-shift.
    int alpha = floor_log2_pow10(kb + offset) - floor_log2_pow10(kb) - offset;
    FMT_ASSERT(alpha > 0 && alpha < 64, "shifting error detected");

    // Try to recover the real cache.
    uint64_t pow5 = data::powers_of_5_64[offset];
    uint128_wrapper recovered_cache = umul128(base_cache.high(), pow5);
    uint128_wrapper middle_low =
        umul128(base_cache.low() - (kb < 0 ? 1u : 0u), pow5);

    recovered_cache += middle_low.high();

    uint64_t high_to_middle = recovered_cache.high() << (64 - alpha);
    uint64_t middle_to_low = recovered_cache.low() << (64 - alpha);

    recovered_cache =
        uint128_wrapper{(recovered_cache.low() >> alpha) | high_to_middle,
                        ((middle_low.low() >> alpha) | middle_to_low)};

    if (kb < 0) recovered_cache += 1;

    // Get error.
    int error_idx = (k - float_info<double>::min_k) / 16;
    uint32_t error = (data::dragonbox_pow10_recovery_errors[error_idx] >>
                      ((k - float_info<double>::min_k) % 16) * 2) &
                     0x3;

    // Add the error back.
    FMT_ASSERT(recovered_cache.low() + error >= recovered_cache.low(), "");
    return {recovered_cache.high(), recovered_cache.low() + error};
#endif
  }